

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBcollider.cpp
# Opt level: O3

eCollSuccess __thiscall
chrono::collision::CHOBBcollider::ComputeCollisions
          (CHOBBcollider *this,ChMatrix33<double> *R1,Vector *T1,ChCollisionTree *oc1,
          ChMatrix33<double> *R2,Vector *T2,ChCollisionTree *oc2,eCollMode flag)

{
  ChMatrix33<double> *alignment;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 (*pauVar3) [16];
  double dVar4;
  double dVar5;
  double dVar6;
  eCollSuccess eVar7;
  eCollSuccess eVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 in_XMM4_Qb;
  timeval thistime;
  double local_70;
  Vector local_68;
  Vector local_48;
  
  gettimeofday((timeval *)&thistime,(__timezone_ptr_t)0x0);
  auVar9._0_8_ = (double)thistime.tv_sec;
  local_48.m_data[0] = T1->m_data[0];
  local_48.m_data[1] = T1->m_data[1];
  local_48.m_data[2] = T1->m_data[2];
  local_68.m_data[0] = T2->m_data[0];
  local_68.m_data[1] = T2->m_data[1];
  local_68.m_data[2] = T2->m_data[2];
  eVar7 = ChNarrowPhaseCollider::ComputeCollisions
                    (&this->super_ChNarrowPhaseCollider,R1,&local_48,oc1,R2,&local_68,oc2,flag);
  eVar8 = ChC_RESULT_GENERICERROR;
  if (eVar7 == ChC_RESULT_OK) {
    (this->super_ChNarrowPhaseCollider).num_bv_tests = 0;
    (this->super_ChNarrowPhaseCollider).num_geo_tests = 0;
    if (ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
        ::Rtemp == '\0') {
      ComputeCollisions();
    }
    if (ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
        ::bR == '\0') {
      ComputeCollisions();
    }
    if (ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
        ::bT == '\0') {
      ComputeCollisions();
    }
    auVar9._8_8_ = 0;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (double)thistime.tv_usec;
    auVar9 = vfmadd231sd_fma(auVar9,auVar13,ZEXT816(0x3eb0c6f7a0b5ed8d));
    if (ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
        ::Ttemp == '\0') {
      ComputeCollisions();
    }
    thistime.tv_usec = (__suseconds_t)oc2[1]._vptr_ChCollisionTree;
    alignment = &(this->super_ChNarrowPhaseCollider).R;
    thistime.tv_sec = (__time_t)alignment;
    ChMatrix33<double>::operator=
              (&ComputeCollisions::Rtemp,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&thistime);
    thistime.tv_sec = (__time_t)oc1[1]._vptr_ChCollisionTree;
    thistime.tv_usec = (__suseconds_t)&ComputeCollisions::Rtemp;
    ChMatrix33<double>::operator=
              (&ComputeCollisions::bR,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&thistime);
    ChTransform<double>::TransformLocalToParent
              ((ChVector<double> *)(oc2[1]._vptr_ChCollisionTree + 9),
               &(this->super_ChNarrowPhaseCollider).T,alignment);
    pauVar3 = (undefined1 (*) [16])oc1[1]._vptr_ChCollisionTree;
    dVar4 = (double)thistime.tv_usec - *(double *)pauVar3[5];
    dVar5 = (double)thistime.tv_sec - *(double *)(pauVar3[4] + 8);
    dVar6 = local_70 - *(double *)(pauVar3[5] + 8);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)pauVar3[1];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar5;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar4 * *(double *)(pauVar3[2] + 8);
    auVar13 = vfmadd231sd_fma(auVar18,auVar10,auVar1);
    auVar14._0_8_ = dVar4 * *(double *)(pauVar3[1] + 8);
    auVar14._8_8_ = dVar4 * *(double *)pauVar3[2];
    auVar11._8_8_ = dVar5;
    auVar11._0_8_ = dVar5;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)pauVar3[4];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar6;
    auVar1 = vfmadd231sd_fma(auVar13,auVar17,auVar2);
    auVar13 = vfmadd132pd_fma(auVar11,auVar14,*pauVar3);
    auVar15._8_8_ = dVar6;
    auVar15._0_8_ = dVar6;
    ComputeCollisions::bT.m_data._0_16_ = vfmadd132pd_fma(auVar15,auVar13,pauVar3[3]);
    ComputeCollisions::bT.m_data[2] = auVar1._0_8_;
    CollideRecurse(this,&ComputeCollisions::bR,&ComputeCollisions::bT,(CHOBBTree *)oc1,0,
                   (CHOBBTree *)oc2,0,flag);
    gettimeofday((timeval *)&thistime,(__timezone_ptr_t)0x0);
    auVar12._0_8_ = (double)thistime.tv_sec;
    auVar12._8_8_ = in_XMM4_Qb;
    eVar8 = ChC_RESULT_OK;
    auVar16._0_8_ = (double)thistime.tv_usec;
    auVar16._8_8_ = in_XMM4_Qb;
    auVar13 = vfmadd132sd_fma(auVar16,auVar12,ZEXT816(0x3eb0c6f7a0b5ed8d));
    (this->super_ChNarrowPhaseCollider).query_time_secs = auVar13._0_8_ - auVar9._0_8_;
  }
  return eVar8;
}

Assistant:

ChNarrowPhaseCollider::eCollSuccess CHOBBcollider::ComputeCollisions(ChMatrix33<>& R1,
                                                                     Vector T1,
                                                                     ChCollisionTree* oc1,
                                                                     ChMatrix33<>& R2,
                                                                     Vector T2,
                                                                     ChCollisionTree* oc2,
                                                                     eCollMode flag) {
    double t1 = GetTime();

    // INHERIT parent class behavior

    if (ChNarrowPhaseCollider::ComputeCollisions(R1, T1, oc1, R2, T2, oc2, flag) != ChC_RESULT_OK)
        return ChC_RESULT_GENERICERROR;

    // Downcasting
    CHOBBTree* o1 = (CHOBBTree*)oc1;
    CHOBBTree* o2 = (CHOBBTree*)oc2;

    // clear the stats

    this->num_bv_tests = 0;
    this->num_geo_tests = 0;

    // compute the transform from o1->child(0) to o2->child(0)

    static ChMatrix33<> Rtemp;
    static ChMatrix33<> bR;
    static Vector bT;
    static Vector Ttemp;

    Rtemp = this->R * o2->child(0)->Rot;  // MxM(Rtemp,this->R,o2->child(0)->R);
    bR = o1->child(0)->Rot * Rtemp;       // MTxM(R,o1->child(0)->R,Rtemp);

    Ttemp = ChTransform<>::TransformLocalToParent(o2->child(0)->To, this->T,
                                                  this->R);  // MxVpV(Ttemp,this->R,o2->child(0)->To,this->T);
    Ttemp = Vsub(Ttemp, o1->child(0)->To);                   // VmV(Ttemp,Ttemp,o1->child(0)->To);

    bT = o1->child(0)->Rot.transpose() * Ttemp;  // MTxV(T,o1->child(0)->R,Ttemp);

    // now start with both top level BVs

    CollideRecurse(bR, bT, o1, 0, o2, 0, flag);

    double t2 = GetTime();
    this->query_time_secs = t2 - t1;

    return ChC_RESULT_OK;
}